

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceGet(zes_driver_handle_t hDriver,uint32_t *pCount,zes_device_handle_t *phDevices)

{
  zes_device_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  zes_pfnDeviceGet_t pfnGet;
  ze_result_t result;
  zes_device_handle_t *phDevices_local;
  uint32_t *pCount_local;
  zes_driver_handle_t hDriver_local;
  
  pfnGet._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011caa8 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phDevices != (zes_device_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zes_device_handle_t)context_t::get((context_t *)&context);
      phDevices[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGet._4_4_ = (*DAT_0011caa8)(hDriver,pCount,phDevices);
  }
  return pfnGet._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGet(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sysman devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sysman devices available.
                                                        ///< if count is greater than the number of sysman devices available, then
                                                        ///< the driver shall update the value with the correct number of sysman
                                                        ///< devices available.
        zes_device_handle_t* phDevices                  ///< [in,out][optional][range(0, *pCount)] array of handle of sysman devices.
                                                        ///< if count is less than the number of sysman devices available, then
                                                        ///< driver shall only retrieve that number of sysman devices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zesDdiTable.Device.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( hDriver, pCount, phDevices );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phDevices ) && ( i < *pCount ); ++i )
                phDevices[ i ] = reinterpret_cast<zes_device_handle_t>( context.get() );

        }

        return result;
    }